

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

void Dau_DsdPermute(char *pDsd)

{
  int nVars_00;
  char *pcVar1;
  int local_58;
  int nVars;
  int pPerm [16];
  char *local_10;
  char *pDsd_local;
  
  nVars_00 = Dau_DsdFindVarNum(pDsd);
  Dau_DsdGenRandPerm(&local_58,nVars_00);
  local_10 = pDsd + -1;
  while (pcVar1 = local_10 + 1, local_10[1] != '\0') {
    local_10 = pcVar1;
    if (('`' < *pcVar1) && ((int)*pcVar1 < nVars_00 + 0x61)) {
      *pcVar1 = (char)(&local_58)[*pcVar1 + -0x61] + 'a';
    }
  }
  return;
}

Assistant:

void Dau_DsdPermute( char * pDsd )
{
    int pPerm[16];
    int nVars = Dau_DsdFindVarNum( pDsd );
    Dau_DsdGenRandPerm( pPerm, nVars );
    pDsd--;
    while ( *++pDsd )
        if ( *pDsd >= 'a' && *pDsd < 'a' + nVars )
            *pDsd = 'a' + pPerm[*pDsd - 'a'];
}